

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::TraceInstrUses(BackwardPass *this,BasicBlock *block,Instr *instr,bool isStart)

{
  Phase PVar1;
  bool bVar2;
  char16_t *pcVar3;
  
  if ((this->isCollectionPass != true) || (this->tag == CaptureByteCodeRegUsePhase)) {
    bVar2 = IsTraceEnabled(this);
    if ((bVar2) && (DAT_015d346a == '\x01')) {
      PVar1 = this->tag;
      if (PVar1 == CaptureByteCodeRegUsePhase) {
        pcVar3 = L"CAPTURE BYTECODE REGISTER";
      }
      else if (PVar1 == BackwardPhase) {
        pcVar3 = L"BACKWARD";
      }
      else {
        pcVar3 = L"UNKNOWN";
        if (PVar1 == DeadStorePhase) {
          pcVar3 = L"DEADSTORE";
        }
      }
      if (isStart) {
        Output::Print(L">>>>>>>>>>>>>>>>>>>>>> %s: Instr Start\n",pcVar3);
      }
      else {
        Output::Print(L"---------------------------------------\n");
      }
      IR::Instr::Dump(instr);
      DumpBlockData(this,block,instr);
      if (isStart) {
        Output::Print(L"----------------------------------------\n");
        return;
      }
      Output::Print(L"<<<<<<<<<<<<<<<<<<<<<< %s: Instr End\n",pcVar3);
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::TraceInstrUses(BasicBlock * block, IR::Instr* instr, bool isStart)
{
    if ((!IsCollectionPass() || tag == Js::CaptureByteCodeRegUsePhase) && IsTraceEnabled() && Js::Configuration::Global.flags.Verbose)
    {
        const char16* tagName = 
            tag == Js::CaptureByteCodeRegUsePhase ? _u("CAPTURE BYTECODE REGISTER") : (
            tag == Js::BackwardPhase ? _u("BACKWARD") : (
            tag == Js::DeadStorePhase ? _u("DEADSTORE") :
            _u("UNKNOWN")
        ));
        if (isStart)
        {
            Output::Print(_u(">>>>>>>>>>>>>>>>>>>>>> %s: Instr Start\n"), tagName);
        }
        else
        {
            Output::Print(_u("---------------------------------------\n"));
        }
        instr->Dump();
        DumpBlockData(block, instr);
        if (isStart)
        {
            Output::Print(_u("----------------------------------------\n"));
        }
        else
        {
            Output::Print(_u("<<<<<<<<<<<<<<<<<<<<<< %s: Instr End\n"), tagName);
        }
    }
}